

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O0

void fld_import(limb_t *dst,uint8_t *src)

{
  int fill;
  uint64_t tmp;
  int i;
  uint8_t *src_local;
  limb_t *dst_local;
  
  tmp = 0;
  fill = 0;
  src_local = src;
  for (i = 0; i < 5; i = i + 1) {
    for (; fill < 0x33; fill = fill + 8) {
      tmp = (ulong)*src_local << ((byte)fill & 0x3f) | tmp;
      src_local = src_local + 1;
    }
    dst[i] = tmp & 0x7ffffffffffff;
    tmp = tmp >> 0x33;
    fill = fill + -0x33;
  }
  *dst = tmp * 0x13 + *dst;
  return;
}

Assistant:

void
fld_import(fld_t dst, const uint8_t src[32])
{
	int i;
	uint64_t tmp = 0;
	int fill = 0;

	for (i = 0; i < FLD_LIMB_NUM; i++) {
		for (;fill < FLD_LIMB_BITS; fill += 8)
			tmp |= (uint64_t)*src++ << fill;

		dst[i] = tmp & FLD_LIMB_MASK;
		tmp >>= FLD_LIMB_BITS;
		fill -= FLD_LIMB_BITS;
	}
	dst[0] += 19*tmp;

	/* dst is now reduced and partially carried (first limb may
	 * use 52bits instead of 51).
	 */
}